

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::
write_padded<fmt::v6::internal::nonfinite_writer<wchar_t>>
          (basic_writer<fmt::v6::buffer_range<wchar_t>_> *this,format_specs *specs,
          nonfinite_writer<wchar_t> *f)

{
  type tVar1;
  basic_writer<fmt::v6::buffer_range<wchar_t>_> *this_00;
  wchar_t *pwVar2;
  fill_t<wchar_t> *fill;
  wchar_t *pwVar3;
  nonfinite_writer<wchar_t> *in_RDX;
  int *in_RSI;
  size_t left_padding;
  checked_ptr<typename_buffer<wchar_t>::value_type> *it;
  size_t fill_size;
  size_t padding;
  size_t num_code_points;
  size_t size;
  uint width;
  wchar_t **in_stack_ffffffffffffff88;
  undefined8 *n;
  
  tVar1 = to_unsigned<int>(*in_RSI);
  this_00 = (basic_writer<fmt::v6::buffer_range<wchar_t>_> *)nonfinite_writer<wchar_t>::size(in_RDX)
  ;
  if (tVar1 != 0) {
    this_00 = (basic_writer<fmt::v6::buffer_range<wchar_t>_> *)
              nonfinite_writer<wchar_t>::width((nonfinite_writer<wchar_t> *)0x1d6bfd);
  }
  if (this_00 < (basic_writer<fmt::v6::buffer_range<wchar_t>_> *)(ulong)tVar1) {
    pwVar2 = (wchar_t *)fill_t<wchar_t>::size((fill_t<wchar_t> *)(in_RSI + 3));
    fill = (fill_t<wchar_t> *)
           basic_writer<fmt::v6::buffer_range<wchar_t>_>::reserve
                     (this_00,(size_t)in_stack_ffffffffffffff88);
    n = (undefined8 *)&stack0xffffffffffffffa8;
    if ((*(byte *)((long)in_RSI + 9) & 0xf) == 2) {
      pwVar2 = fill<wchar_t*,wchar_t>(pwVar2,(size_t)n,fill);
      *n = pwVar2;
      nonfinite_writer<wchar_t>::operator()
                ((nonfinite_writer<wchar_t> *)this_00,in_stack_ffffffffffffff88);
    }
    else if ((*(byte *)((long)in_RSI + 9) & 0xf) == 3) {
      pwVar3 = fill<wchar_t*,wchar_t>(pwVar2,(size_t)n,fill);
      *n = pwVar3;
      nonfinite_writer<wchar_t>::operator()
                ((nonfinite_writer<wchar_t> *)this_00,in_stack_ffffffffffffff88);
      pwVar2 = fill<wchar_t*,wchar_t>(pwVar2,(size_t)n,fill);
      *n = pwVar2;
    }
    else {
      nonfinite_writer<wchar_t>::operator()
                ((nonfinite_writer<wchar_t> *)this_00,in_stack_ffffffffffffff88);
      pwVar2 = fill<wchar_t*,wchar_t>(pwVar2,(size_t)n,fill);
      *n = pwVar2;
    }
  }
  else {
    basic_writer<fmt::v6::buffer_range<wchar_t>_>::reserve(this_00,(size_t)in_RDX);
    nonfinite_writer<wchar_t>::operator()((nonfinite_writer<wchar_t> *)this_00,(wchar_t **)in_RDX);
  }
  return;
}

Assistant:

void write_padded(const format_specs& specs, F&& f) {
    // User-perceived width (in code points).
    unsigned width = to_unsigned(specs.width);
    size_t size = f.size();  // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points) return f(reserve(size));
    size_t padding = width - num_code_points;
    size_t fill_size = specs.fill.size();
    auto&& it = reserve(size + padding * fill_size);
    if (specs.align == align::right) {
      it = fill(it, padding, specs.fill);
      f(it);
    } else if (specs.align == align::center) {
      std::size_t left_padding = padding / 2;
      it = fill(it, left_padding, specs.fill);
      f(it);
      it = fill(it, padding - left_padding, specs.fill);
    } else {
      f(it);
      it = fill(it, padding, specs.fill);
    }
  }